

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void ipred_ipf_core_s16(pel *src,pel *dst,int i_dst,s16 *pred,int flt_range_hor,int flt_range_ver,
                       s8 *flt_hor_coef,s8 *flt_ver_coef,int w,int h,int bit_depth)

{
  uint uVar1;
  int iVar2;
  pel pVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = ~(-1 << ((byte)bit_depth & 0x1f));
  if (flt_range_ver < 1) {
    flt_range_ver = 0;
  }
  else {
    uVar5 = 0;
    do {
      iVar2 = (int)flt_ver_coef[uVar5];
      uVar4 = 0;
      if (0 < flt_range_hor) {
        uVar7 = 0;
        do {
          uVar1 = (int)((uint)src[uVar7 + 1] * iVar2 + (uint)src[~uVar5] * (int)flt_hor_coef[uVar7]
                        + (int)pred[uVar7] * ((0x40 - iVar2) - (int)flt_hor_coef[uVar7]) + 0x20) >>
                  6;
          uVar4 = uVar1;
          if ((int)uVar6 <= (int)uVar1) {
            uVar4 = uVar6;
          }
          pVar3 = (pel)uVar4;
          if ((int)uVar1 < 0) {
            pVar3 = '\0';
          }
          dst[uVar7] = pVar3;
          uVar7 = uVar7 + 1;
          uVar4 = flt_range_hor;
        } while ((uint)flt_range_hor != uVar7);
      }
      if ((int)uVar4 < w) {
        uVar7 = (ulong)uVar4;
        do {
          uVar1 = (int)((uint)src[uVar7 + 1] * iVar2 + (int)pred[uVar7] * (0x40 - iVar2) + 0x20) >>
                  6;
          uVar4 = uVar6;
          if ((int)uVar1 < (int)uVar6) {
            uVar4 = uVar1;
          }
          pVar3 = (pel)uVar4;
          if ((int)uVar1 < 0) {
            pVar3 = '\0';
          }
          dst[uVar7] = pVar3;
          uVar7 = uVar7 + 1;
        } while ((uint)w != uVar7);
      }
      dst = dst + i_dst;
      pred = pred + w;
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)flt_range_ver);
  }
  if (flt_range_ver < h) {
    uVar5 = (ulong)(uint)flt_range_ver;
    do {
      if (0 < w) {
        uVar7 = 0;
        do {
          iVar2 = 0;
          if ((long)uVar7 < (long)flt_range_hor) {
            iVar2 = (int)flt_hor_coef[uVar7];
          }
          uVar1 = (int)((uint)src[(int)~(uint)uVar5] * iVar2 + (int)pred[uVar7] * (0x40 - iVar2) +
                       0x20) >> 6;
          uVar4 = uVar1;
          if ((int)uVar6 <= (int)uVar1) {
            uVar4 = uVar6;
          }
          pVar3 = (pel)uVar4;
          if ((int)uVar1 < 0) {
            pVar3 = '\0';
          }
          dst[uVar7] = pVar3;
          uVar7 = uVar7 + 1;
        } while ((uint)w != uVar7);
      }
      dst = dst + i_dst;
      uVar5 = uVar5 + 1;
      pred = pred + w;
    } while (uVar5 != (uint)h);
  }
  return;
}

Assistant:

void ipred_ipf_core_s16(pel *src, pel *dst, int i_dst, s16 *pred, int flt_range_hor, int flt_range_ver, const s8 *flt_hor_coef, const s8 *flt_ver_coef, int w, int h, int bit_depth)
{
    pel *p_top = src + 1;
    int max_val = (1 << bit_depth) - 1;
    int row;

    for (row = 0; row < flt_range_ver; ++row) {
        s32 coeff_top = flt_ver_coef[row];
        int col;

        for (col = 0; col < flt_range_hor; col++) {
            s32 coeff_left = flt_hor_coef[col];
            s32 coeff_cur = 64 - coeff_left - coeff_top;
            s32 sample_val = (coeff_left* src[-row - 1] + coeff_top * p_top[col] + coeff_cur * pred[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        for (; col < w; col++) {
            s32 coeff_cur = 64 - coeff_top;
            s32 sample_val = (coeff_top * p_top[col] + coeff_cur * pred[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        dst += i_dst;
        pred += w;
    }
    for (; row < h; ++row) {
        for (s32 col = 0; col < w; col++) {
            s32 coeff_left = (col < flt_range_hor) ? flt_hor_coef[col] : 0;
            s32 coeff_cur = 64 - coeff_left;
            s32 sample_val = (coeff_left* src[-row - 1] + coeff_cur * pred[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        dst += i_dst;
        pred += w;
    }
}